

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  wchar_t x;
  wchar_t y;
  wchar_t *pwVar2;
  int iVar3;
  ulong uVar4;
  loc_conflict lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t local_6c;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t *local_60;
  wchar_t *local_58;
  ui_entry_combiner_funcs local_50;
  
  uVar7 = 0x16;
  if (details->alternate_color_first == false) {
    uVar7 = 0;
  }
  local_64 = nlabel;
  local_60 = label;
  local_58 = auxvals;
  if (((L'+' < info->ncolors) && (L'\f' < info->nlabcolors)) && (L'\x15' < info->nsym)) {
    if (L'\0' < n) {
      lVar5.y = 0;
      lVar5.x = (details->value_position).x;
      uVar10 = (ulong)(uint)(details->value_position).y;
      uVar9 = 0;
      do {
        wVar1 = vals[uVar9];
        if (wVar1 < L'\x7ffffffd') {
          uVar4 = 3;
          if (wVar1 < L'\x03') {
            uVar4 = 1;
            if (wVar1 < L'\x01') {
              uVar4 = (ulong)((uint)(wVar1 != L'\0') * 2);
            }
          }
        }
        else {
          uVar4 = 6 - (ulong)(uint)(wVar1 + L'\x80000003');
        }
        wVar1 = local_58[uVar9];
        if (wVar1 < L'\x7ffffffd') {
          uVar6 = 3;
          if (wVar1 < L'\x03') {
            uVar6 = 1;
            if (wVar1 < L'\x01') {
              uVar6 = (ulong)((uint)(wVar1 != L'\0') * 2);
            }
          }
        }
        else {
          uVar6 = 6 - (ulong)(uint)(wVar1 + L'\x80000003');
        }
        Term_putch(lVar5.x,(wchar_t)uVar10,
                   info->colors
                   [(long)*(int *)(&DAT_002734f0 + uVar6 * 4 + uVar4 * 0x1c) + (long)(int)uVar7],
                   info->symbols[*(int *)(&DAT_002734f0 + uVar6 * 4 + uVar4 * 0x1c)]);
        lVar5 = loc_sum((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar10 << 0x20),
                        (loc_conflict)details->position_step);
        uVar10 = (ulong)lVar5 >> 0x20;
        uVar7 = uVar7 ^ 0x16;
        uVar9 = uVar9 + 1;
      } while ((uint)n != uVar9);
    }
    wVar1 = local_64;
    if ((L'\0' < local_64) || (details->show_combined == true)) {
      iVar3 = ui_entry_combiner_get_funcs(info->combiner_index,&local_50);
      if (iVar3 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                      ,0x259,
                      "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                     );
      }
      (*local_50.vec_func)(n,vals,local_58,&local_68,&local_6c);
      pwVar2 = local_60;
      if (L'\0' < wVar1) {
        if (details->known_rune == true) {
          if (local_68 < L'\x7ffffffd') {
            uVar9 = 3;
            if (local_68 < L'\x03') {
              uVar9 = 1;
              if (local_68 < L'\x01') {
                uVar9 = (ulong)((uint)(local_68 != L'\0') * 2);
              }
            }
          }
          else {
            uVar9 = 6 - (ulong)(uint)(local_68 + L'\x80000003');
          }
          if (local_6c < L'\x7ffffffd') {
            uVar10 = 3;
            if (local_6c < L'\x03') {
              uVar10 = 1;
              if (local_6c < L'\x01') {
                uVar10 = (ulong)((uint)(local_6c != L'\0') * 2);
              }
            }
          }
          else {
            uVar10 = 6 - (ulong)(uint)(local_6c + L'\x80000003');
          }
          lVar8 = (long)*(int *)(&DAT_002735c0 + uVar10 * 4 + uVar9 * 0x1c);
        }
        else {
          lVar8 = 0;
        }
        x = (details->label_position).x;
        y = (details->label_position).y;
        if (details->vertical_label == true) {
          uVar9 = 1;
          if (L'\x01' < wVar1) {
            uVar9 = (ulong)(uint)wVar1;
          }
          uVar10 = 0;
          do {
            Term_putch(x,y + (int)uVar10,info->label_colors[lVar8],pwVar2[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        else {
          safe_queue_chars(x,y,wVar1,info->label_colors[lVar8],local_60);
        }
      }
      if (details->show_combined == true) {
        show_combined_generic(info,details,local_68,local_6c);
      }
    }
    return;
  }
  __assert_fail("info->ncolors >= 44 && info->nlabcolors >= 13 && info->nsym >= 22",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                ,0x242,
                "void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_COMPACT_RESIST_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	/*
	 * Fastest varying is no timed effect, timed resistance,
	 * timed vulnerability, timed immunity, unknown timed effect,
	 * no value for timed effect, timed resistance + timed vulnerability
	 */
	const int combined_effect_tbl[7][7] = {
		/* No permanent effect */
		{  2,  6,  9, 11,  2,  2, 18 },
		/* Permanent resistance */
		{  3,  7, 10, 12,  3,  3, 19 },
		/* Permanent vulnerability */
		{  4,  8,  4, 13,  4,  4, 20 },
		/* Permanent immunity */
		{  5,  5,  5,  5,  5,  5,  5 },
		/* Unknown permanent effect */
		{  0,  0,  0,  0,  0,  0,  0 },
		/* No value for permanent effect */
		{  1,  1,  1,  1,  1,  1,  1 },
		/* Permanent resistance + permanent vulnerability */
		{ 14, 15, 16, 17, 14, 14, 21 }
	};
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 22 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 44 && info->nlabcolors >= 13 &&
		info->nsym >= 22);

	for (i = 0; i < n; ++i) {
		int untimed_effect = convert_vanilla_res_level(vals[i]);
		int timed_effect = convert_vanilla_res_level(auxvals[i]);
		int palette_index;

		assert(untimed_effect >= 0 && untimed_effect < 7 &&
			timed_effect >= 0 && timed_effect < 7);
		palette_index =
			combined_effect_tbl[untimed_effect][timed_effect];
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 22;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		const int combined_label_tbl[7][7] = {
			/* No permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* Permanent resistance */
			{ 2, 6, 9, 11, 2, 2, 2 },
			/* Permanent vulnerability */
			{ 3, 7, 3, 12, 3, 3, 3 },
			/* Permanent immunity */
			{ 4, 4, 4,  4, 4, 4, 4 },
			/* Unknown permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* No value for permanent effect */
			{ 1, 5, 8, 10, 1, 1, 1 },
			/* Permanent resistance + permanent vulnerability */
			{ 1, 5, 8, 10, 1, 1, 1 }
		};
		int palette_index;

		if (details->known_rune) {
			int untimed_effect = convert_vanilla_res_level(vc);
			int timed_effect = convert_vanilla_res_level(ac);

			assert(untimed_effect >= 0 && untimed_effect < 7 &&
				timed_effect >= 0 && timed_effect < 7);
			palette_index =
				combined_label_tbl[untimed_effect][timed_effect];
		} else {
			palette_index = 0;
		}

		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}